

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.hpp
# Opt level: O3

int SaveEXR(Vector *img,int w,int h,string *filename)

{
  void *pvVar1;
  int iVar2;
  int *piVar3;
  undefined8 uVar4;
  long lVar5;
  size_type sVar6;
  size_type __new_size;
  double *pdVar7;
  char *err;
  vector<float,_std::allocator<float>_> images [3];
  float *image_ptr [3];
  char *names [3];
  EXRImage image;
  code *apcStack_1140 [2];
  char *local_1130;
  vector<float,_std::allocator<float>_> local_1128;
  vector<float,_std::allocator<float>_> vStack_1110;
  vector<float,_std::allocator<float>_> local_10f8;
  pointer local_10d8;
  pointer local_10d0;
  pointer local_10c8;
  char *local_10b8;
  char *pcStack_10b0;
  char *local_10a8;
  EXRImage local_1098;
  
  local_1098.channel_names = (char **)0x0;
  local_1098.images = (uchar **)0x0;
  local_1098.pixel_types = (int *)0x0;
  local_1098.requested_pixel_types = (int *)0x0;
  local_1098.compression = 3;
  local_1098.num_custom_attributes = 0;
  local_1098.num_channels = 3;
  local_10a8 = "R";
  local_10b8 = "B";
  pcStack_10b0 = "G";
  local_10f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_10f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_10f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  vStack_1110.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  vStack_1110.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_1128.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  vStack_1110.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_1128.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_1128.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  __new_size = (size_type)(h * w);
  apcStack_1140[0] = (code *)0x115733;
  std::vector<float,_std::allocator<float>_>::resize(&local_1128,__new_size);
  apcStack_1140[0] = (code *)0x115740;
  std::vector<float,_std::allocator<float>_>::resize(&vStack_1110,__new_size);
  apcStack_1140[0] = (code *)0x11574d;
  std::vector<float,_std::allocator<float>_>::resize(&local_10f8,__new_size);
  if (0 < h * w) {
    pdVar7 = &img->z;
    sVar6 = 0;
    do {
      local_1128.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start[sVar6] = (float)((Vector *)(pdVar7 + -2))->x;
      vStack_1110.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start[sVar6] = (float)pdVar7[-1];
      local_10f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start[sVar6] = (float)*pdVar7;
      sVar6 = sVar6 + 1;
      pdVar7 = pdVar7 + 3;
    } while (__new_size != sVar6);
  }
  if (local_10f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish !=
      local_10f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start) {
    local_10d8 = local_10f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start;
    if (vStack_1110.super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        vStack_1110.super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_start) {
      local_10d0 = vStack_1110.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start;
      if (local_1128.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          local_1128.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start) {
        local_1098.images = (uchar **)&local_10d8;
        local_10c8 = local_1128.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start;
        local_1098.channel_names = &local_10b8;
        local_1098.compression = 3;
        apcStack_1140[0] = (code *)0x115816;
        local_1098.width = w;
        local_1098.height = h;
        piVar3 = (int *)malloc(0xc);
        apcStack_1140[0] = (code *)0x11582b;
        local_1098.pixel_types = piVar3;
        local_1098.requested_pixel_types = (int *)malloc(0xc);
        lVar5 = 0;
        do {
          piVar3[lVar5] = 2;
          local_1098.requested_pixel_types[lVar5] = 1;
          lVar5 = lVar5 + 1;
        } while (lVar5 != 3);
        apcStack_1140[0] = (code *)0x115862;
        iVar2 = SaveMultiChannelEXRToFile(&local_1098,(filename->_M_dataplus)._M_p,&local_1130);
        if (iVar2 != 0) {
          apcStack_1140[0] = (code *)0x1158c3;
          SaveEXR();
        }
        apcStack_1140[0] = (code *)0x115875;
        free(local_1098.pixel_types);
        apcStack_1140[0] = (code *)0x115882;
        free(local_1098.requested_pixel_types);
        lVar5 = 0x48;
        do {
          pvVar1 = *(void **)((long)apcStack_1140 + lVar5);
          if (pvVar1 != (void *)0x0) {
            apcStack_1140[0] = (code *)0x11589f;
            operator_delete(pvVar1,*(long *)((long)&local_1130 + lVar5) - (long)pvVar1);
          }
          lVar5 = lVar5 + -0x18;
        } while (lVar5 != 0);
        return iVar2;
      }
    }
  }
  apcStack_1140[0] = (code *)0x1158d7;
  uVar4 = std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0
                    );
  lVar5 = 0x48;
  do {
    pvVar1 = *(void **)((long)apcStack_1140 + lVar5);
    if (pvVar1 != (void *)0x0) {
      apcStack_1140[0] = (code *)0x1158fb;
      operator_delete(pvVar1,*(long *)((long)&local_1130 + lVar5) - (long)pvVar1);
    }
    lVar5 = lVar5 + -0x18;
  } while (lVar5 != 0);
  apcStack_1140[0] = indirect_filter;
  _Unwind_Resume(uVar4);
}

Assistant:

int SaveEXR(const Vector* img, int w, int h, const std::string& filename) {
   EXRImage image;
   InitEXRImage(&image);
   image.num_channels  = 3;
   const char* names[] = {"B", "G", "R"};

    std::vector<float> images[3];
    images[0].resize(w * h);
    images[1].resize(w * h);
    images[2].resize(w * h);

    for (int i = 0; i < w * h; i++) {
      images[0][i] = img[i].x;
      images[1][i] = img[i].y;
      images[2][i] = img[i].z;
    }

    float* image_ptr[3];
    image_ptr[0] = &(images[2].at(0)); // B
    image_ptr[1] = &(images[1].at(0)); // G
    image_ptr[2] = &(images[0].at(0)); // R

    image.channel_names = names;
    image.images = (unsigned char**)image_ptr;
    image.width = w;
    image.height = h;
    image.compression = TINYEXR_COMPRESSIONTYPE_ZIP;

    image.pixel_types = (int *)malloc(sizeof(int) * image.num_channels);
    image.requested_pixel_types = (int *)malloc(sizeof(int) * image.num_channels);
    for (int i = 0; i < image.num_channels; i++) {
      image.pixel_types[i] = TINYEXR_PIXELTYPE_FLOAT; // pixel type of input image
      image.requested_pixel_types[i] = TINYEXR_PIXELTYPE_HALF; // pixel type of output image to be stored in .EXR
    }

    const char* err;
    int ret = SaveMultiChannelEXRToFile(&image, filename.c_str(), &err);
    if (ret != 0) {
      fprintf(stderr, "Save EXR err: %s\n", err);
    }

    free(image.pixel_types);
    free(image.requested_pixel_types);
    return ret;
}